

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2c8643::BracedRangeExpr::printLeft(BracedRangeExpr *this,OutputStream *S)

{
  Node *this_00;
  StringView R;
  StringView R_00;
  
  OutputStream::operator+=(S,'[');
  Node::print(this->First,S);
  R.Last = "";
  R.First = " ... ";
  OutputStream::operator+=(S,R);
  Node::print(this->Last,S);
  OutputStream::operator+=(S,']');
  this_00 = this->Init;
  if ((this_00->K & ~KDotSuffix) != KBracedExpr) {
    R_00.Last = "";
    R_00.First = " = ";
    OutputStream::operator+=(S,R_00);
    this_00 = this->Init;
  }
  Node::print(this_00,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += '[';
    First->print(S);
    S += " ... ";
    Last->print(S);
    S += ']';
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }